

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O3

_Bool ts_range_array_intersects
                (TSRangeArray *self,uint start_index,uint32_t start_byte,uint32_t end_byte)

{
  int iVar1;
  uint i;
  uint32_t *puVar2;
  
  iVar1 = self->size - start_index;
  if (start_index <= self->size && iVar1 != 0) {
    puVar2 = &self->contents[start_index].end_byte;
    do {
      if (start_byte < *puVar2) {
        return puVar2[-1] < end_byte;
      }
      puVar2 = puVar2 + 6;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return false;
}

Assistant:

bool ts_range_array_intersects(const TSRangeArray *self, unsigned start_index,
                               uint32_t start_byte, uint32_t end_byte) {
  for (unsigned i = start_index; i < self->size; i++) {
    TSRange *range = &self->contents[i];
    if (range->end_byte > start_byte) {
      if (range->start_byte >= end_byte) break;
      return true;
    }
  }
  return false;
}